

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * aux_upvalue(StkId fi,int n,TValue **val,CClosure **owner,UpVal **uv)

{
  CClosure *pCVar1;
  lua_CFunction p_Var2;
  long lVar3;
  uint uVar4;
  StkId local_68;
  Proto *p;
  TString *name;
  LClosure *f_1;
  CClosure *f;
  UpVal **uv_local;
  CClosure **owner_local;
  TValue **val_local;
  int n_local;
  StkId fi_local;
  
  uVar4 = fi->tt_ & 0x3f;
  if (uVar4 == 6) {
    p_Var2 = (fi->value_).f;
    lVar3 = *(long *)(p_Var2 + 0x18);
    if ((n < 1) || (*(int *)(lVar3 + 0x10) < n)) {
      fi_local = (StkId)0x0;
    }
    else {
      *val = (TValue *)**(undefined8 **)(p_Var2 + (long)(n + -1) * 8 + 0x20);
      if (uv != (UpVal **)0x0) {
        *uv = *(UpVal **)(p_Var2 + (long)(n + -1) * 8 + 0x20);
      }
      lVar3 = *(long *)(*(long *)(lVar3 + 0x58) + (long)(n + -1) * 0x10);
      if (lVar3 == 0) {
        local_68 = (StkId)0x1361f0;
      }
      else {
        local_68 = (StkId)(lVar3 + 0x18);
      }
      fi_local = local_68;
    }
  }
  else if (uVar4 == 0x26) {
    pCVar1 = (CClosure *)(fi->value_).f;
    if ((n < 1) || ((int)(uint)pCVar1->nupvalues < n)) {
      fi_local = (StkId)0x0;
    }
    else {
      *val = pCVar1->upvalue + (n + -1);
      if (owner != (CClosure **)0x0) {
        *owner = pCVar1;
      }
      fi_local = (StkId)0x137165;
    }
  }
  else {
    fi_local = (StkId)0x0;
  }
  return (char *)fi_local;
}

Assistant:

static const char *aux_upvalue(StkId fi, int n, TValue **val,
                               CClosure **owner, UpVal **uv) {
    switch (ttype(fi)) {
        case LUA_TCCL: {  /* C closure */
            CClosure *f = clCvalue(fi);
            if (!(1 <= n && n <= f->nupvalues)) return NULL;
            *val = &f->upvalue[n - 1];
            if (owner) *owner = f;
            return "";
        }
        case LUA_TLCL: {  /* Lua closure */
            LClosure *f = clLvalue(fi);
            TString *name;
            Proto *p = f->p;
            if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
            *val = f->upvals[n - 1]->v;
            if (uv) *uv = f->upvals[n - 1];
            name = p->upvalues[n - 1].name;
            return (name == NULL) ? "(*no name)" : getstr(name);
        }
        default:
            return NULL;  /* not a closure */
    }
}